

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitu.c
# Opt level: O0

boolean u_slip_free(monst *mtmp,attack *mattk)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *local_50;
  obj *local_30;
  obj *local_28;
  obj *obj;
  attack *mattk_local;
  monst *mtmp_local;
  
  if (uarmc == (obj *)0x0) {
    local_30 = uarm;
  }
  else {
    local_30 = uarmc;
  }
  local_28 = local_30;
  if (local_30 == (obj *)0x0) {
    local_28 = uarmu;
  }
  if (mattk->adtyp == ' ') {
    local_28 = uarmh;
  }
  if ((local_28 == (obj *)0x0) ||
     ((((*(uint *)&local_28->field_0x4a >> 0x14 & 1) == 0 && (local_28->otyp != 0x80)) &&
      ((local_28->oprops & 0x40U) == 0)))) {
LAB_0022c87b:
    mtmp_local._7_1_ = '\0';
  }
  else {
    if ((*(uint *)&local_28->field_0x4a & 1) != 0) {
      iVar1 = rn2(3);
      if (iVar1 == 0) goto LAB_0022c87b;
    }
    pcVar2 = Monnam(mtmp);
    pcVar3 = "grabs you, but cannot hold onto";
    if (mattk->adtyp == '\x1c') {
      pcVar3 = "slips off of";
    }
    pcVar4 = "slippery";
    if ((*(uint *)&local_28->field_0x4a >> 0x14 & 1) != 0) {
      pcVar4 = "greased";
    }
    if (((*(uint *)&local_28->field_0x4a >> 0x14 & 1) == 0) &&
       ((objects[local_28->otyp].field_0x10 & 1) == 0)) {
      local_50 = cloak_simple_name(local_28);
    }
    else {
      local_50 = xname(local_28);
    }
    pline("%s %s your %s %s!",pcVar2,pcVar3,pcVar4,local_50);
    if ((*(uint *)&local_28->field_0x4a >> 0x14 & 1) != 0) {
      iVar1 = rn2(2);
      if (iVar1 == 0) {
        pline("The grease wears off.");
        *(uint *)&local_28->field_0x4a = *(uint *)&local_28->field_0x4a & 0xffefffff;
        update_inventory();
      }
    }
    mtmp_local._7_1_ = '\x01';
  }
  return mtmp_local._7_1_;
}

Assistant:

static boolean u_slip_free(struct monst *mtmp, const struct attack *mattk)
{
	struct obj *obj = (uarmc ? uarmc : uarm);

	if (!obj) obj = uarmu;
	if (mattk->adtyp == AD_DRIN) obj = uarmh;

	/* if your cloak/armor is greased, monster slips off; this
	   protection might fail (33% chance) when the armor is cursed */
	if (obj && (obj->greased || obj->otyp == OILSKIN_CLOAK ||
		    (obj->oprops & ITEM_OILSKIN)) &&
		(!obj->cursed || rn2(3))) {
	    pline("%s %s your %s %s!",
		  Monnam(mtmp),
		  (mattk->adtyp == AD_WRAP) ?
			"slips off of" : "grabs you, but cannot hold onto",
		  obj->greased ? "greased" : "slippery",
		  /* avoid "slippery slippery cloak"
		     for undiscovered oilskin cloak */
		  (obj->greased || objects[obj->otyp].oc_name_known) ?
			xname(obj) : cloak_simple_name(obj));

	    if (obj->greased && !rn2(2)) {
		pline("The grease wears off.");
		obj->greased = 0;
		update_inventory();
	    }
	    return TRUE;
	}
	return FALSE;
}